

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

void __thiscall duckdb::StandardBufferManager::ReserveMemory(StandardBufferManager *this,idx_t size)

{
  idx_t in_RCX;
  TempBufferPoolReservation reservation;
  string local_50;
  TempBufferPoolReservation local_30;
  
  if (size != 0) {
    StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,(StringUtil *)size,0x400,in_RCX);
    EvictBlocksOrThrow<char_const*,std::__cxx11::string>
              (&local_30,this,EXTENSION,size,
               (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
               "failed to reserve memory data of size %s%s",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_30.super_BufferPoolReservation.size = 0;
    TempBufferPoolReservation::~TempBufferPoolReservation(&local_30);
  }
  return;
}

Assistant:

void StandardBufferManager::ReserveMemory(idx_t size) {
	if (size == 0) {
		return;
	}
	auto reservation =
	    EvictBlocksOrThrow(MemoryTag::EXTENSION, size, nullptr, "failed to reserve memory data of size %s%s",
	                       StringUtil::BytesToHumanReadableString(size));
	reservation.size = 0;
}